

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

Pla_Man_t * Pla_GenFromMinterms(char *pName,Vec_Int_t *vMints,int nVars)

{
  uint uVar1;
  Pla_Man_t *p;
  word *pwVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  p = Pla_ManAlloc(pName,nVars,1,vMints->nSize);
  iVar6 = (p->vCubes).nSize;
  iVar7 = 0;
  if (iVar6 < 1) {
    iVar6 = iVar7;
  }
  for (; iVar7 != iVar6; iVar7 = iVar7 + 1) {
    pwVar2 = Pla_CubeIn(p,iVar7);
    uVar1 = Vec_IntEntry(vMints,iVar7);
    bVar4 = 0;
    uVar3 = p->nIns;
    if (p->nIns < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pwVar2[uVar5 >> 5] =
           pwVar2[uVar5 >> 5] | (ulong)((uVar1 >> (uVar5 & 0x1f) & 1) != 0) + 1 << (bVar4 & 0x3e);
      bVar4 = bVar4 + 2;
    }
  }
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    pwVar2 = Pla_CubeOut(p,iVar7);
    *(byte *)pwVar2 = (byte)*pwVar2 | 2;
  }
  return p;
}

Assistant:

Pla_Man_t * Pla_GenFromMinterms( char * pName, Vec_Int_t * vMints, int nVars )
{
    Pla_Man_t * p = Pla_ManAlloc( pName, nVars, 1, Vec_IntSize(vMints) );
    int i, k, Lit, Mint;
    word * pCube;
    Pla_ForEachCubeIn( p, pCube, i )
    {
        Mint = Vec_IntEntry(vMints, i);
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            Pla_CubeSetLit( pCube, k, ((Mint >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
    }
    Pla_ForEachCubeOut( p, pCube, i )
        Pla_CubeSetLit( pCube, 0, PLA_LIT_ONE );
    return p;
}